

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O3

ssize_t __thiscall Disk::write(Disk *this,int __fd,void *__buf,size_t __n)

{
  mutex *__mutex;
  CylHead CVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  mapped_type *pmVar5;
  undefined8 uVar6;
  undefined4 in_register_00000034;
  CylHead *pCVar7;
  CylHead cylhead;
  CylHead local_50;
  vector<Sector,_std::allocator<Sector>_> local_48;
  
  pCVar7 = (CylHead *)CONCAT44(in_register_00000034,__fd);
  (this->fmt).sectors = 0;
  __mutex = &this->m_trackdata_mutex;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 == 0) {
    local_50 = *pCVar7;
    pmVar5 = std::
             map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
             ::operator[](&this->m_trackdata,&local_50);
    iVar4 = pCVar7[1].cyl;
    iVar2 = pCVar7[1].head;
    pmVar5->cylhead = *pCVar7;
    pmVar5->m_type = iVar4;
    pmVar5->m_flags = iVar2;
    iVar4 = pCVar7[2].head;
    (pmVar5->m_track).tracklen = pCVar7[2].cyl;
    (pmVar5->m_track).tracktime = iVar4;
    local_48.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pmVar5->m_track).m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    CVar1 = pCVar7[4];
    local_48.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.super__Vector_impl_data.
    _M_start = (pmVar5->m_track).m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_48.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pmVar5->m_track).m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    (pmVar5->m_track).m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pCVar7[3];
    (pmVar5->m_track).m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)CVar1;
    (pmVar5->m_track).m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pCVar7[5];
    pCVar7[5].cyl = 0;
    pCVar7[5].head = 0;
    pCVar7[3].cyl = 0;
    pCVar7[3].head = 0;
    pCVar7[4].cyl = 0;
    pCVar7[4].head = 0;
    std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_48);
    iVar4 = pCVar7[6].head;
    (pmVar5->m_bitstream).datarate = pCVar7[6].cyl;
    (pmVar5->m_bitstream).encoding = iVar4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&(pmVar5->m_bitstream).m_data,pCVar7 + 7);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (&(pmVar5->m_bitstream).m_indexes,pCVar7 + 10);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (&(pmVar5->m_bitstream).m_sync_losses,pCVar7 + 0xd);
    (pmVar5->m_bitstream).m_wrapped = SUB41(pCVar7[0x12].cyl,0);
    iVar4 = pCVar7[0x10].head;
    iVar2 = pCVar7[0x11].cyl;
    iVar3 = pCVar7[0x11].head;
    (pmVar5->m_bitstream).m_bitsize = pCVar7[0x10].cyl;
    (pmVar5->m_bitstream).m_bitpos = iVar4;
    (pmVar5->m_bitstream).m_splicepos = iVar2;
    (pmVar5->m_bitstream).m_next_index = iVar3;
    local_48.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)(pmVar5->m_flux).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    CVar1 = pCVar7[0x14];
    local_48.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(pmVar5->m_flux).
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
    local_48.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(pmVar5->m_flux).
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    (pmVar5->m_flux).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar7[0x13];
    (pmVar5->m_flux).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)CVar1;
    (pmVar5->m_flux).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pCVar7[0x15];
    pCVar7[0x15].cyl = 0;
    pCVar7[0x15].head = 0;
    pCVar7[0x13].cyl = 0;
    pCVar7[0x13].head = 0;
    pCVar7[0x14].cyl = 0;
    pCVar7[0x14].head = 0;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&local_48);
    pmVar5->m_normalised_flux = SUB41(pCVar7[0x16].cyl,0);
    pmVar5 = std::
             map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
             ::operator[](&this->m_trackdata,&local_50);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return (ssize_t)pmVar5;
  }
  uVar6 = std::__throw_system_error(iVar4);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar6);
}

Assistant:

const TrackData& Disk::write(TrackData&& trackdata)
{
    // Invalidate stored format, since we can no longer guarantee a match
    fmt.sectors = 0;

    std::lock_guard<std::mutex> lock(m_trackdata_mutex);
    auto cylhead = trackdata.cylhead;
    m_trackdata[cylhead] = std::move(trackdata);
    return m_trackdata[cylhead];
}